

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priest.c
# Opt level: O2

void angry_priest(void)

{
  char roomno;
  uint uVar1;
  int iVar2;
  monst *mtmp;
  
  roomno = temple_occupied(u.urooms);
  mtmp = findpriest(roomno);
  if (mtmp != (monst *)0x0) {
    wakeup(mtmp);
    if (level->locations[(char)mtmp->field_0x76][(char)mtmp->field_0x77].typ == '!') {
      uVar1 = *(uint *)&level->locations[(char)mtmp->field_0x76][(char)mtmp->field_0x77].field_0x6
              >> 4 & 7;
      if (uVar1 == 0) {
        iVar2 = -0x80;
      }
      else if (uVar1 == 4) {
        iVar2 = 1;
      }
      else {
        iVar2 = uVar1 - 2;
      }
      if (iVar2 == (char)mtmp->field_0x74) {
        return;
      }
    }
    *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xebffffff | 0x4000000;
    mtmp->field_0x75 = 0;
  }
  return;
}

Assistant:

void angry_priest(void)
{
	struct monst *priest;
	struct rm *loc;

	if ((priest = findpriest(temple_occupied(u.urooms))) != 0) {
	    wakeup(priest);
	    /*
	     * If the altar has been destroyed or converted, let the
	     * priest run loose.
	     * (When it's just a conversion and there happens to be
	     *	a fresh corpse nearby, the priest ought to have an
	     *	opportunity to try converting it back; maybe someday...)
	     */
	    loc = &level->locations[EPRI(priest)->shrpos.x][EPRI(priest)->shrpos.y];
	    if (!IS_ALTAR(loc->typ) ||
		((aligntyp)Amask2align(loc->altarmask & AM_MASK) !=
			EPRI(priest)->shralign)) {
		priest->ispriest = 0;		/* now a roamer */
		priest->isminion = 1;		/* but still aligned */
		/* this overloads the `shroom' field, which is now clobbered */
		EPRI(priest)->renegade = 0;
	    }
	}
}